

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int run_container_cardinality(run_container_t *run)

{
  uint uVar1;
  int iVar2;
  int32_t n_runs;
  long lVar3;
  long lVar4;
  
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 2) != 0) {
    iVar2 = _avx512_run_container_cardinality(run);
    return iVar2;
  }
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 1) != 0) {
    iVar2 = _avx2_run_container_cardinality(run);
    return iVar2;
  }
  iVar2 = run->n_runs;
  lVar3 = (long)iVar2;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      iVar2 = iVar2 + (uint)run->runs[lVar4].length;
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return iVar2;
}

Assistant:

int run_container_cardinality(const run_container_t *run) {
#if CROARING_COMPILER_SUPPORTS_AVX512
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX512) {
        return _avx512_run_container_cardinality(run);
    } else
#endif
        if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
        return _avx2_run_container_cardinality(run);
    } else {
        return _scalar_run_container_cardinality(run);
    }
}